

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void __thiscall VRle::Data::opIntersect(Data *this,View a,View b)

{
  bool bVar1;
  View *pVVar2;
  Span *pSVar3;
  size_t sVar4;
  EVP_PKEY_CTX *src;
  pointer dst;
  size_t count;
  Result result;
  Span *bEnd;
  Span *bPtr;
  Span *aEnd;
  Span *aPtr;
  Data *in_stack_fffffffffffff7c0;
  Result *in_stack_fffffffffffff7e0;
  rle_view *in_stack_fffffffffffff7e8;
  rle_view *in_stack_fffffffffffff7f0;
  View local_70;
  View local_60;
  View local_50;
  View local_40;
  Span *local_30;
  Span *local_28;
  Span *local_20;
  Span *local_18;
  View *local_10;
  View *local_8;
  
  local_8 = &local_60;
  local_10 = &local_70;
  local_18 = View::data(local_8);
  pSVar3 = View::data(local_8);
  sVar4 = View::size(local_8);
  local_20 = pSVar3 + sVar4;
  local_28 = View::data(local_10);
  pSVar3 = View::data(local_10);
  sVar4 = View::size(local_10);
  local_30 = pSVar3 + sVar4;
  while( true ) {
    bVar1 = false;
    if (local_18 != local_20) {
      bVar1 = local_18->y < local_28->y;
    }
    if (!bVar1) break;
    local_18 = local_18 + 1;
  }
  if (local_18 != local_20) {
    while( true ) {
      bVar1 = false;
      if (local_28 != local_30) {
        bVar1 = local_28->y < local_18->y;
      }
      if (!bVar1) break;
      local_28 = local_28 + 1;
    }
  }
  View::View(&local_40,local_18,(long)local_20 - (long)local_18 >> 3);
  pVVar2 = local_8;
  local_8->_data = local_40._data;
  pVVar2->_size = local_40._size;
  View::View(&local_50,local_28,(long)local_30 - (long)local_28 >> 3);
  pVVar2 = local_10;
  local_10->_data = local_50._data;
  pVVar2->_size = local_50._size;
  std::array<VRle::Span,_255UL>::array((array<VRle::Span,_255UL> *)pSVar3);
  while (sVar4 = View::size(&local_60), sVar4 != 0) {
    src = (EVP_PKEY_CTX *)
          _opIntersect(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0
                      );
    if (src != (EVP_PKEY_CTX *)0x0) {
      dst = std::array<VRle::Span,_255UL>::data((array<VRle::Span,_255UL> *)0x122d0e);
      copy((EVP_PKEY_CTX *)dst,src);
    }
  }
  updateBbox(in_stack_fffffffffffff7c0);
  return;
}

Assistant:

void VRle::Data::opIntersect(VRle::View a, VRle::View b)
{
    _opIntersectPrepare(a, b);
    Result result;
    while (a.size()) {
        auto count = _opIntersect(a, b, result);
        if (count) copy(result.data(), count, mSpans);
    }

    updateBbox();
}